

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall el::base::LogDispatcher::dispatch(LogDispatcher *this)

{
  TypedConfigurations *this_00;
  bool bVar1;
  Level level;
  Logger *pLVar2;
  element_type *peVar3;
  PreRollOutCallback *preRollOutCallback;
  reference __p;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
  local_80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
  *local_50;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
  *h;
  iterator __end2;
  iterator __begin2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>_>
  *__range2;
  LogDispatchData data;
  LogDispatchCallback *callback;
  TypedConfigurations *tc;
  LogDispatcher *this_local;
  
  if (((this->m_proceed & 1U) != 0) && (this->m_dispatchAction == None)) {
    this->m_proceed = false;
  }
  if ((this->m_proceed & 1U) != 0) {
    pLVar2 = LogMessage::logger(this->m_logMessage);
    this_00 = pLVar2->m_typedConfigurations;
    peVar3 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)elStorage);
    bVar1 = Storage::hasFlag(peVar3,StrictLogFileSizeCheck);
    if (bVar1) {
      level = LogMessage::level(this->m_logMessage);
      peVar3 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)elStorage);
      preRollOutCallback = Storage::preRollOutCallback(peVar3);
      TypedConfigurations::validateFileRolling(this_00,level,preRollOutCallback);
    }
    data.m_dispatchAction = 0;
    data._12_4_ = 0;
    LogDispatchData::LogDispatchData((LogDispatchData *)&__range2);
    peVar3 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)elStorage);
    __end2 = utils::std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>_>
             ::begin(&peVar3->m_logDispatchCallbacks);
    h = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
         *)utils::std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>_>
           ::end(&peVar3->m_logDispatchCallbacks);
    while (bVar1 = utils::std::__detail::operator!=
                             (&__end2.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>,_true>
                              ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>,_true>
                                *)&h), bVar1) {
      __p = utils::std::__detail::
            _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>,_false,_true>
            ::operator*(&__end2);
      utils::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
      ::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>,_true>
                (&local_80,__p);
      local_50 = &local_80;
      data._8_8_ = utils::std::__shared_ptr<el::LogDispatchCallback,_(__gnu_cxx::_Lock_policy)2>::
                   get(&local_80.second.
                        super___shared_ptr<el::LogDispatchCallback,_(__gnu_cxx::_Lock_policy)2>);
      if (((element_type *)data._8_8_ != (element_type *)0x0) &&
         (bVar1 = Callback<el::LogDispatchData>::enabled
                            ((Callback<el::LogDispatchData> *)data._8_8_), bVar1)) {
        LogDispatchData::setLogMessage((LogDispatchData *)&__range2,this->m_logMessage);
        LogDispatchData::setDispatchAction((LogDispatchData *)&__range2,this->m_dispatchAction);
        (**(code **)(*(long *)data._8_8_ + 0x28))(data._8_8_,&__range2);
      }
      utils::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
      ::~pair(&local_80);
      utils::std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>,_false,_true>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void LogDispatcher::dispatch(void) {
  if (m_proceed && m_dispatchAction == base::DispatchAction::None) {
    m_proceed = false;
  }
  if (!m_proceed) {
    return;
  }
  base::TypedConfigurations* tc = m_logMessage->logger()->m_typedConfigurations;
  if (ELPP->hasFlag(LoggingFlag::StrictLogFileSizeCheck)) {
    tc->validateFileRolling(m_logMessage->level(), ELPP->preRollOutCallback());
  }
  LogDispatchCallback* callback = nullptr;
  LogDispatchData data;
  for (const std::pair<std::string, base::type::LogDispatchCallbackPtr>& h
       : ELPP->m_logDispatchCallbacks) {
    callback = h.second.get();
    if (callback != nullptr && callback->enabled()) {
      data.setLogMessage(m_logMessage);
      data.setDispatchAction(m_dispatchAction);
      callback->handle(&data);
    }
  }
}